

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthPermute(uint *pOut,uint *pIn,int nVars,char *pPerm,int fReturnIn)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  uint *pOut_00;
  uint uVar7;
  
  uVar7 = 0;
  do {
    bVar4 = true;
    if (1 < nVars) {
      bVar4 = false;
      uVar6 = 0;
      pOut_00 = pOut;
      do {
        cVar2 = pPerm[uVar6];
        cVar3 = pPerm[uVar6 + 1];
        uVar1 = uVar6 + 1;
        if (cVar2 == cVar3) {
          __assert_fail("pPerm[i] != pPerm[i+1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                        ,0xf1,
                        "void Kit_TruthPermute(unsigned int *, unsigned int *, int, char *, int)");
        }
        pOut = pOut_00;
        if (cVar3 < cVar2) {
          uVar7 = uVar7 + 1;
          pPerm[uVar6] = cVar3;
          pPerm[uVar6 + 1] = cVar2;
          Kit_TruthSwapAdjacentVars(pOut_00,pIn,nVars,(int)uVar6);
          bVar4 = true;
          pOut = pIn;
          pIn = pOut_00;
        }
        uVar6 = uVar1;
        pOut_00 = pOut;
      } while (nVars - 1 != uVar1);
      bVar4 = !bVar4;
    }
  } while (!bVar4);
  if ((uVar7 & 1 ^ fReturnIn) != 1) {
    uVar7 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar7 = 1;
    }
    if (0 < (int)uVar7) {
      lVar5 = (ulong)uVar7 + 1;
      do {
        pOut[lVar5 + -2] = pIn[lVar5 + -2];
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
  }
  return;
}

Assistant:

void Kit_TruthPermute( unsigned * pOut, unsigned * pIn, int nVars, char * pPerm, int fReturnIn )
{
    unsigned * pTemp;
    int i, Temp, fChange, Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            assert( pPerm[i] != pPerm[i+1] );
            if ( pPerm[i] <= pPerm[i+1] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pPerm[i];
            pPerm[i] = pPerm[i+1];
            pPerm[i+1] = Temp;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
}